

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  GetterYs<unsigned_int> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  GetterYRef *pGVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  ImVec2 IVar13;
  double dVar14;
  double dVar15;
  ImVec2 IVar16;
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pIVar17 = GImPlot;
  pGVar7 = this->Getter1;
  dVar14 = (double)(prim + 1);
  dVar3 = pGVar7->XScale;
  dVar4 = pGVar7->X0;
  pTVar8 = this->Transformer;
  iVar6 = pGVar7->Count;
  dVar15 = log10((double)*(uint *)((long)pGVar7->Ys +
                                  (long)(((prim + 1 + pGVar7->Offset) % iVar6 + iVar6) % iVar6) *
                                  (long)pGVar7->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar6 = pTVar8->YAxis;
  pIVar9 = pIVar17->CurrentPlot;
  dVar5 = pIVar9->YAxis[iVar6].Range.Min;
  fVar23 = (float)(((dVar3 * dVar14 + dVar4) - (pIVar9->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar6].Min.x);
  fVar21 = (float)((((double)(float)(dVar15 / pIVar17->LogDenY[iVar6]) *
                     (pIVar9->YAxis[iVar6].Range.Max - dVar5) + dVar5) - dVar5) * pIVar17->My[iVar6]
                  + (double)pIVar17->PixelRange[iVar6].Min.y);
  pGVar10 = this->Getter2;
  dVar3 = pGVar10->XScale;
  dVar4 = pGVar10->X0;
  pTVar8 = this->Transformer;
  dVar15 = log10(pGVar10->YRef / GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar6 = pTVar8->YAxis;
  pIVar9 = pIVar18->CurrentPlot;
  dVar5 = pIVar9->YAxis[iVar6].Range.Min;
  fVar20 = (float)(((dVar14 * dVar3 + dVar4) - (pIVar9->XAxis).Range.Min) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar6].Min.x);
  fVar25 = (float)((((double)(float)(dVar15 / pIVar18->LogDenY[iVar6]) *
                     (pIVar9->YAxis[iVar6].Range.Max - dVar5) + dVar5) - dVar5) * pIVar18->My[iVar6]
                  + (double)pIVar18->PixelRange[iVar6].Min.y);
  fVar22 = (this->P12).x;
  fVar24 = fVar22 - fVar20;
  fVar27 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar28 = fVar27 * fVar21 - fVar23 * fVar1;
  fVar22 = fVar22 * fVar25 - fVar20 * fVar2;
  fVar27 = fVar27 - fVar23;
  fVar26 = fVar27 * (fVar2 - fVar25) - fVar24 * (fVar1 - fVar21);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11->col = this->Col;
  pIVar11[1].pos.x = fVar23;
  pIVar11[1].pos.y = fVar21;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[1].col = this->Col;
  IVar16.y = ((fVar2 - fVar25) * fVar28 - (fVar1 - fVar21) * fVar22) / fVar26;
  IVar16.x = (fVar28 * fVar24 - fVar27 * fVar22) / fVar26;
  pIVar11[2].pos = IVar16;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[2].col = this->Col;
  pIVar11[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[3].col = this->Col;
  IVar13.y = fVar25;
  IVar13.x = fVar20;
  pIVar11[4].pos = IVar13;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar11 + 5;
  puVar12 = DrawList->_IdxWritePtr;
  *puVar12 = DrawList->_VtxCurrentIdx;
  uVar19 = -(uint)(fVar2 < fVar1 && fVar21 < fVar25 || fVar1 < fVar2 && fVar25 < fVar21) & 1;
  puVar12[1] = DrawList->_VtxCurrentIdx + uVar19 + 1;
  puVar12[2] = DrawList->_VtxCurrentIdx + 3;
  puVar12[3] = DrawList->_VtxCurrentIdx + 1;
  puVar12[4] = (uVar19 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar12[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar12 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar23;
  (this->P11).y = fVar21;
  (this->P12).x = fVar20;
  (this->P12).y = fVar25;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }